

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ut_metadata.cpp
# Opt level: O3

void __thiscall
libtorrent::anon_unknown_5::ut_metadata_peer_plugin::maybe_send_request
          (ut_metadata_peer_plugin *this)

{
  int iVar1;
  ut_metadata_plugin *puVar2;
  pointer pmVar3;
  iterator __position;
  int iVar4;
  int iVar5;
  time_point tVar6;
  pointer pmVar7;
  pointer pmVar8;
  element_type *peVar9;
  pointer pmVar10;
  vector<metadata_piece> *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  bool bVar11;
  bool bVar12;
  int piece;
  int local_3c;
  duration local_38;
  
  iVar4 = (*(this->m_pc->super_peer_connection).super_bandwidth_socket._vptr_bandwidth_socket[1])();
  if ((char)iVar4 != '\0') {
    return;
  }
  if (0 < (((this->m_torrent->super_torrent_hot_members).m_torrent_file.
            super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
          m_files).m_piece_length) {
    return;
  }
  if (this->m_message_index == 0) {
    return;
  }
  if (4 < (ulong)((long)(this->m_sent_requests).super__Vector_base<int,_std::allocator<int>_>.
                        _M_impl.super__Vector_impl_data._M_finish -
                 (long)(this->m_sent_requests).super__Vector_base<int,_std::allocator<int>_>._M_impl
                       .super__Vector_impl_data._M_start)) {
    return;
  }
  if (((this->m_pc->super_peer_connection).field_0x887 & 8) == 0) {
    tVar6 = aux::time_now();
    if ((long)tVar6.__d.__r <= (this->m_request_limit).__d.__r) {
      return;
    }
    bVar11 = ((this->m_pc->super_peer_connection).field_0x887 & 8) == 0;
  }
  else {
    bVar11 = false;
  }
  puVar2 = this->m_tp;
  pmVar7 = (puVar2->m_requested_metadata).
           super_vector<libtorrent::(anonymous_namespace)::ut_metadata_plugin::metadata_piece,_std::allocator<libtorrent::(anonymous_namespace)::ut_metadata_plugin::metadata_piece>_>
           .
           super__Vector_base<libtorrent::(anonymous_namespace)::ut_metadata_plugin::metadata_piece,_std::allocator<libtorrent::(anonymous_namespace)::ut_metadata_plugin::metadata_piece>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pmVar3 = (puVar2->m_requested_metadata).
           super_vector<libtorrent::(anonymous_namespace)::ut_metadata_plugin::metadata_piece,_std::allocator<libtorrent::(anonymous_namespace)::ut_metadata_plugin::metadata_piece>_>
           .
           super__Vector_base<libtorrent::(anonymous_namespace)::ut_metadata_plugin::metadata_piece,_std::allocator<libtorrent::(anonymous_namespace)::ut_metadata_plugin::metadata_piece>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pmVar8 = pmVar7 + 1;
  pmVar10 = pmVar7;
  if (pmVar8 != pmVar3 && pmVar7 != pmVar3) {
    iVar4 = pmVar7->num_requests;
    do {
      if (pmVar8->num_requests < iVar4) {
        pmVar10 = pmVar8;
        iVar4 = pmVar8->num_requests;
      }
      pmVar8 = pmVar8 + 1;
    } while (pmVar8 != pmVar3);
  }
  this_00 = &puVar2->m_requested_metadata;
  if (pmVar7 == pmVar3) {
    aux::
    container_wrapper<libtorrent::(anonymous_namespace)::ut_metadata_plugin::metadata_piece,int,std::vector<libtorrent::(anonymous_namespace)::ut_metadata_plugin::metadata_piece,std::allocator<libtorrent::(anonymous_namespace)::ut_metadata_plugin::metadata_piece>>>
    ::resize<int,void>((container_wrapper<libtorrent::(anonymous_namespace)::ut_metadata_plugin::metadata_piece,int,std::vector<libtorrent::(anonymous_namespace)::ut_metadata_plugin::metadata_piece,std::allocator<libtorrent::(anonymous_namespace)::ut_metadata_plugin::metadata_piece>>>
                        *)this_00,1);
    pmVar7 = (this_00->
             super_vector<libtorrent::(anonymous_namespace)::ut_metadata_plugin::metadata_piece,_std::allocator<libtorrent::(anonymous_namespace)::ut_metadata_plugin::metadata_piece>_>
             ).
             super__Vector_base<libtorrent::(anonymous_namespace)::ut_metadata_plugin::metadata_piece,_std::allocator<libtorrent::(anonymous_namespace)::ut_metadata_plugin::metadata_piece>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pmVar10 = pmVar7;
  }
  iVar4 = (int)((ulong)((long)pmVar10 - (long)pmVar7) >> 5);
  this_01 = pmVar7[iVar4].source.
            super___weak_ptr<libtorrent::(anonymous_namespace)::ut_metadata_peer_plugin,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi;
  if (this_01 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    this_01 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
LAB_0039f031:
    peVar9 = (element_type *)0x0;
  }
  else {
    iVar5 = this_01->_M_use_count;
    peVar9 = (element_type *)0x0;
    do {
      if (iVar5 == 0) {
        this_01 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        goto LAB_0039f038;
      }
      LOCK();
      iVar1 = this_01->_M_use_count;
      bVar12 = iVar5 == iVar1;
      if (bVar12) {
        this_01->_M_use_count = iVar5 + 1;
        iVar1 = iVar5;
      }
      iVar5 = iVar1;
      UNLOCK();
    } while (!bVar12);
    if (this_01->_M_use_count == 0) goto LAB_0039f031;
    peVar9 = pmVar7[iVar4].source.
             super___weak_ptr<libtorrent::(anonymous_namespace)::ut_metadata_peer_plugin,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
  }
LAB_0039f038:
  tVar6 = aux::time_now();
  pmVar8 = (this_00->
           super_vector<libtorrent::(anonymous_namespace)::ut_metadata_plugin::metadata_piece,_std::allocator<libtorrent::(anonymous_namespace)::ut_metadata_plugin::metadata_piece>_>
           ).
           super__Vector_base<libtorrent::(anonymous_namespace)::ut_metadata_plugin::metadata_piece,_std::allocator<libtorrent::(anonymous_namespace)::ut_metadata_plugin::metadata_piece>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (peVar9 != (element_type *)0x0) {
    local_38 = tVar6.__d.__r;
    iVar5 = (*(peVar9->m_pc->super_peer_connection).super_bandwidth_socket._vptr_bandwidth_socket[1]
            )();
    pmVar8 = (this_00->
             super_vector<libtorrent::(anonymous_namespace)::ut_metadata_plugin::metadata_piece,_std::allocator<libtorrent::(anonymous_namespace)::ut_metadata_plugin::metadata_piece>_>
             ).
             super__Vector_base<libtorrent::(anonymous_namespace)::ut_metadata_plugin::metadata_piece,_std::allocator<libtorrent::(anonymous_namespace)::ut_metadata_plugin::metadata_piece>_>
             ._M_impl.super__Vector_impl_data._M_start;
    tVar6.__d.__r = (duration)(duration)local_38.__r;
    if (((char)iVar5 == '\0') &&
       (iVar5 = -1, local_38.__r - (rep)pmVar8[iVar4].last_request.__d < 3000000000))
    goto LAB_0039f095;
  }
  pmVar8[iVar4].num_requests = pmVar8[iVar4].num_requests + 1;
  iVar5 = iVar4;
  if (!bVar11) {
    pmVar8[iVar4].last_request.__d = tVar6.__d.__r;
  }
LAB_0039f095:
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
  }
  if (iVar5 != -1) {
    __position._M_current =
         (this->m_sent_requests).super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    local_3c = iVar5;
    if (__position._M_current ==
        (this->m_sent_requests).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      ::std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                ((vector<int,std::allocator<int>> *)&this->m_sent_requests,__position,&local_3c);
    }
    else {
      *__position._M_current = iVar5;
      (this->m_sent_requests).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish = __position._M_current + 1;
    }
    write_metadata_packet(this,request,local_3c);
  }
  return;
}

Assistant:

void maybe_send_request()
		{
			if (m_pc.is_disconnecting()) return;

			// if we don't have any metadata, and this peer
			// supports the request metadata extension
			// and we aren't currently waiting for a request
			// reply. Then, send a request for some metadata.
			if (!m_torrent.valid_metadata()
				&& m_message_index != 0
				&& m_sent_requests.size() < 2
				&& has_metadata())
			{
				int const piece = m_tp.metadata_request(m_pc.has_metadata());
				if (piece == -1) return;

				m_sent_requests.push_back(piece);
				write_metadata_packet(msg_t::request, piece);
			}
		}